

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_174::GUFAPass::run(GUFAPass *this,Module *module)

{
  PassOptions *options;
  PassRunner *runner;
  GUFAOptimizer local_1d8;
  undefined1 local_60 [8];
  ContentOracle oracle;
  Module *module_local;
  GUFAPass *this_local;
  
  oracle.locationContents._M_h._M_single_bucket = (__node_base_ptr)module;
  options = Pass::getPassOptions(&this->super_Pass);
  ContentOracle::ContentOracle((ContentOracle *)local_60,module,options);
  GUFAOptimizer::GUFAOptimizer
            (&local_1d8,(ContentOracle *)local_60,(bool)(this->optimizing & 1),
             (bool)(this->castAll & 1));
  runner = Pass::getPassRunner(&this->super_Pass);
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
  ::run(&local_1d8.
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
        ,runner,(Module *)oracle.locationContents._M_h._M_single_bucket);
  GUFAOptimizer::~GUFAOptimizer(&local_1d8);
  ContentOracle::~ContentOracle((ContentOracle *)local_60);
  return;
}

Assistant:

void run(Module* module) override {
    ContentOracle oracle(*module, getPassOptions());
    GUFAOptimizer(oracle, optimizing, castAll).run(getPassRunner(), module);
  }